

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O1

PluralFormat * __thiscall icu_63::PluralFormat::operator=(PluralFormat *this,PluralFormat *other)

{
  if (this != other) {
    Locale::operator=(&this->locale,&other->locale);
    MessagePattern::operator=(&this->msgPattern,&other->msgPattern);
    this->offset = other->offset;
    copyObjects(this,other);
  }
  return this;
}

Assistant:

PluralFormat&
PluralFormat::operator=(const PluralFormat& other) {
    if (this != &other) {
        locale = other.locale;
        msgPattern = other.msgPattern;
        offset = other.offset;
        copyObjects(other);
    }

    return *this;
}